

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O0

uint prvTidygetNextErrorCode(TidyIterator *iter)

{
  uint uVar1;
  TidyIterator local_38;
  TidyIterator local_20;
  size_t itemIndex;
  tidyStringsKeyItem *item;
  TidyIterator *iter_local;
  
  itemIndex = 0;
  if (iter != (TidyIterator *)0x0) {
    local_20 = *iter;
    if (local_20 != (TidyIterator)0x0) {
      uVar1 = tidyErrorCodeListSize();
      if (local_20 <= (TidyIterator)(ulong)uVar1) {
        itemIndex = (size_t)(tidyStringsKeys + (long)((long)&local_20[-1]._opaque + 3));
        local_20 = (TidyIterator)((long)&local_20->_opaque + 1);
      }
    }
    uVar1 = tidyErrorCodeListSize();
    if ((TidyIterator)(ulong)uVar1 < local_20) {
      local_38 = (TidyIterator)0x0;
    }
    else {
      local_38 = local_20;
    }
    *iter = local_38;
    return *(uint *)(itemIndex + 8);
  }
  __assert_fail("iter != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/geoffmcl[P]tidy-fork/src/message.c"
                ,0x5d4,"uint prvTidygetNextErrorCode(TidyIterator *)");
}

Assistant:

uint TY_(getNextErrorCode)( TidyIterator* iter )
{
    const tidyStringsKeyItem *item = NULL;
    size_t itemIndex;
    assert( iter != NULL );
    
    itemIndex = (size_t)*iter;
    
    if ( itemIndex > 0 && itemIndex <= tidyErrorCodeListSize() )
    {
        item = &tidyStringsKeys[itemIndex - 1];
        itemIndex++;
    }
    
    *iter = (TidyIterator)( itemIndex <= tidyErrorCodeListSize() ? itemIndex : (size_t)0 );
    return item->value;
}